

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O2

point3d * v3rotate(point3d *p,double theta,point3d *a,point3d *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  vector3d axis;
  matrix4 rotmat;
  point3d local_d8;
  vector3d local_b8;
  matrix4 local_a0;
  
  v3makeVec(b,a,&local_b8);
  v3rotationMat(&local_b8,theta,&local_a0);
  dVar2 = b->x;
  dVar3 = b->y;
  local_d8.x = p->x - dVar2;
  local_d8.y = p->y - dVar3;
  dVar1 = b->z;
  local_d8.z = p->z - dVar1;
  v3mulPointMat(&local_d8,&local_a0);
  p->x = dVar2 + local_d8.x;
  p->y = dVar3 + local_d8.y;
  p->z = dVar1 + local_d8.z;
  return p;
}

Assistant:

point3d*  v3rotate(point3d* p, double theta, point3d* a, point3d* b) {
	vector3d axis;
	point3d  q;
	matrix4  rotmat;

	v3makeVec(b, a, &axis);
	v3rotationMat(&axis, theta, &rotmat);

	v3sub(p, b, &q);
	v3mulPointMat(&q, &rotmat);
	v3add(&q, b, p);

	return(p);
}